

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_ray_box(rf_ray ray,rf_bounding_box box)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float in_stack_00000008;
  float in_stack_0000000c;
  float t [8];
  _Bool collision;
  
  fVar1 = (ray.direction.y - in_stack_00000008) / ray.position.y;
  fVar2 = (box.min.y - in_stack_00000008) / ray.position.y;
  fVar3 = (ray.direction.z - in_stack_0000000c) / ray.position.z;
  fVar4 = (box.min.z - in_stack_0000000c) / ray.position.z;
  fVar5 = (box.min.x - ray.position.x) / ray.direction.x;
  fVar6 = (box.max.x - ray.position.x) / ray.direction.x;
  dVar10 = (double)fVar1;
  dVar7 = (double)fVar2;
  dVar8 = dVar7;
  if (dVar10 <= dVar7) {
    dVar8 = dVar10;
  }
  dVar10 = (double)(~-(ulong)NAN(dVar10) & (ulong)dVar8 | -(ulong)NAN(dVar10) & (ulong)dVar7);
  dVar8 = (double)fVar3;
  dVar11 = (double)fVar4;
  dVar7 = dVar11;
  if (dVar8 <= dVar11) {
    dVar7 = dVar8;
  }
  dVar7 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar7 | -(ulong)NAN(dVar8) & (ulong)dVar11);
  dVar8 = dVar7;
  if (dVar7 <= dVar10) {
    dVar8 = dVar10;
  }
  dVar10 = (double)(~-(ulong)NAN(dVar10) & (ulong)dVar8 | -(ulong)NAN(dVar10) & (ulong)dVar7);
  dVar8 = (double)fVar5;
  dVar11 = (double)fVar6;
  dVar7 = dVar11;
  if (dVar8 <= dVar11) {
    dVar7 = dVar8;
  }
  dVar8 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar7 | -(ulong)NAN(dVar8) & (ulong)dVar11);
  dVar7 = dVar8;
  if (dVar8 <= dVar10) {
    dVar7 = dVar10;
  }
  dVar12 = (double)fVar1;
  dVar9 = (double)fVar2;
  dVar11 = dVar9;
  if (dVar9 <= dVar12) {
    dVar11 = dVar12;
  }
  dVar12 = (double)(~-(ulong)NAN(dVar12) & (ulong)dVar11 | -(ulong)NAN(dVar12) & (ulong)dVar9);
  dVar11 = (double)fVar3;
  dVar13 = (double)fVar4;
  dVar9 = dVar13;
  if (dVar13 <= dVar11) {
    dVar9 = dVar11;
  }
  dVar9 = (double)(~-(ulong)NAN(dVar11) & (ulong)dVar9 | -(ulong)NAN(dVar11) & (ulong)dVar13);
  dVar11 = dVar9;
  if (dVar12 <= dVar9) {
    dVar11 = dVar12;
  }
  dVar12 = (double)(~-(ulong)NAN(dVar12) & (ulong)dVar11 | -(ulong)NAN(dVar12) & (ulong)dVar9);
  dVar11 = (double)fVar5;
  dVar13 = (double)fVar6;
  dVar9 = dVar13;
  if (dVar13 <= dVar11) {
    dVar9 = dVar11;
  }
  dVar11 = (double)(~-(ulong)NAN(dVar11) & (ulong)dVar9 | -(ulong)NAN(dVar11) & (ulong)dVar13);
  dVar9 = dVar11;
  if (dVar12 <= dVar11) {
    dVar9 = dVar12;
  }
  fVar1 = (float)(double)(~-(ulong)NAN(dVar12) & (ulong)dVar9 | -(ulong)NAN(dVar12) & (ulong)dVar11)
  ;
  return 0.0 <= fVar1 &&
         (float)(double)(~-(ulong)NAN(dVar10) & (ulong)dVar7 | -(ulong)NAN(dVar10) & (ulong)dVar8)
         <= fVar1;
}

Assistant:

RF_API bool rf_check_collision_ray_box(rf_ray ray, rf_bounding_box box)
{
    bool collision = false;

    float t[8];
    t[0] = (box.min.x - ray.position.x) / ray.direction.x;
    t[1] = (box.max.x - ray.position.x) / ray.direction.x;
    t[2] = (box.min.y - ray.position.y) / ray.direction.y;
    t[3] = (box.max.y - ray.position.y) / ray.direction.y;
    t[4] = (box.min.z - ray.position.z) / ray.direction.z;
    t[5] = (box.max.z - ray.position.z) / ray.direction.z;
    t[6] = (float) fmax(fmax(fmin(t[0], t[1]), fmin(t[2], t[3])), fmin(t[4], t[5]));
    t[7] = (float) fmin(fmin(fmax(t[0], t[1]), fmax(t[2], t[3])), fmax(t[4], t[5]));

    collision = !(t[7] < 0 || t[6] > t[7]);

    return collision;
}